

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O0

RM_FileHandle * __thiscall RM_FileHandle::operator=(RM_FileHandle *this,RM_FileHandle *fileHandle)

{
  int iVar1;
  PageNum PVar2;
  RM_FileHandle *fileHandle_local;
  RM_FileHandle *this_local;
  
  if (this != fileHandle) {
    this->openedFH = (bool)(fileHandle->openedFH & 1);
    this->header_modified = (bool)(fileHandle->header_modified & 1);
    PF_FileHandle::operator=(&this->pfh,&fileHandle->pfh);
    iVar1 = (fileHandle->header).numRecordsPerPage;
    (this->header).recordSize = (fileHandle->header).recordSize;
    (this->header).numRecordsPerPage = iVar1;
    PVar2 = (fileHandle->header).firstFreePage;
    (this->header).numPages = (fileHandle->header).numPages;
    (this->header).firstFreePage = PVar2;
    iVar1 = (fileHandle->header).bitmapSize;
    (this->header).bitmapOffset = (fileHandle->header).bitmapOffset;
    (this->header).bitmapSize = iVar1;
  }
  return this;
}

Assistant:

RM_FileHandle& RM_FileHandle::operator= (const RM_FileHandle &fileHandle){
  // sets all contents equal to another RM_FileHandle object
  if (this != &fileHandle){
    this->openedFH = fileHandle.openedFH;
    this->header_modified = fileHandle.header_modified;
    this->pfh = fileHandle.pfh;
    memcpy(&this->header, &fileHandle.header, sizeof(struct RM_FileHeader));
  }
  return (*this);
}